

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.cpp
# Opt level: O2

void duckdb::RepeatTableFunction::RegisterFunction(BuiltinFunctions *set)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_3ea;
  allocator local_3e9;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3e8;
  LogicalType local_3d0 [2];
  string local_3a0;
  TableFunction local_380;
  TableFunction repeat;
  
  ::std::__cxx11::string::string((string *)&local_3a0,"repeat",&local_3e9);
  LogicalType::LogicalType(local_3d0,ANY);
  LogicalType::LogicalType(local_3d0 + 1,BIGINT);
  __l._M_len = 2;
  __l._M_array = local_3d0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3e8,__l,&local_3ea);
  TableFunction::TableFunction
            (&repeat,&local_3a0,(vector<duckdb::LogicalType,_true> *)&local_3e8,RepeatFunction,
             RepeatBind,RepeatInit,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3e8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3d0[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_3a0);
  repeat.cardinality = RepeatCardinality;
  TableFunction::TableFunction(&local_380,&repeat);
  BuiltinFunctions::AddFunction(set,&local_380);
  TableFunction::~TableFunction(&local_380);
  TableFunction::~TableFunction(&repeat);
  return;
}

Assistant:

void RepeatTableFunction::RegisterFunction(BuiltinFunctions &set) {
	TableFunction repeat("repeat", {LogicalType::ANY, LogicalType::BIGINT}, RepeatFunction, RepeatBind, RepeatInit);
	repeat.cardinality = RepeatCardinality;
	set.AddFunction(repeat);
}